

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall helics::BrokerBase::queueProcessingLoop(BrokerBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  GlobalFederateId GVar2;
  _func_int *owner;
  string_view message;
  string_view message_00;
  undefined8 uVar3;
  action_t aVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ulong uVar13;
  ActionMessage *command_00;
  ActionMessage *command_01;
  int iVar14;
  undefined8 uVar15;
  string_view name;
  string_view name_00;
  LoopHandle contextLoop;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> dumpMessages;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  type timerCallback;
  optional<helics::ActionMessage> tcmd;
  anon_class_32_4_dda494f4 timerStop;
  steady_timer ticktimer;
  activeProtector active;
  ActionMessage command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [24];
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Head_base<0UL,_asio::io_context_*,_false> local_388;
  size_type local_378;
  undefined1 local_370 [32];
  undefined1 local_350 [184];
  bool local_298;
  anon_class_32_4_dda494f4 local_290;
  size_t local_270;
  GlobalFederateId *pGStack_268;
  undefined1 local_260 [184];
  char local_1a8;
  size_t local_1a0;
  GlobalFederateId *pGStack_198;
  undefined1 local_190 [64];
  _func_int *local_150 [3];
  undefined1 *local_138;
  _func_int **local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 local_118 [16];
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  ActionMessage local_e8;
  
  if (((this->haltOperations)._M_base._M_i & 1U) != 0) {
    LOCK();
    (this->mainLoopIsRunning)._M_base._M_i = false;
    UNLOCK();
    return;
  }
  local_398._M_allocated_capacity = 0;
  local_398._8_8_ = 0;
  local_388._M_head_impl = (io_context *)0x0;
  local_350._8_8_ = (element_type *)0x0;
  local_350._16_4_ = local_350._16_4_ & 0xffffff00;
  local_350._0_8_ = (__pthread_internal_list *)(local_350 + 0x10);
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)local_370,(string *)local_350);
  if ((__pthread_internal_list *)local_350._0_8_ != (__pthread_internal_list *)(local_350 + 0x10)) {
    operator_delete((void *)local_350._0_8_,CONCAT44(local_350._20_4_,local_350._16_4_) + 1);
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_3c8);
  owner = *(_func_int **)(local_370._0_8_ + 0x40);
  local_350._0_8_ =
       &::asio::detail::
        typeid_wrapper<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>
        ::typeinfo;
  local_350._8_8_ = (element_type *)0x0;
  local_190._0_8_ =
       ::asio::detail::service_registry::do_use_service
                 (*(service_registry **)owner,(key *)local_350,
                  ::asio::detail::service_registry::
                  create<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,asio::io_context>
                  ,owner);
  local_190._24_8_ = (wait_op *)0x0;
  local_190._32_8_ = (wait_op *)0x0;
  local_190._40_8_ = 0xffffffffffffffff;
  local_190._48_8_ = (per_timer_data *)0x0;
  local_190._56_8_ = (per_timer_data *)0x0;
  local_130 = local_150;
  local_128 = ::asio::execution::detail::any_executor_base::
              target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
              ::fns_with_execute;
  local_138 = ::asio::execution::detail::any_executor_base::
              object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
              ::fns;
  local_120 = ::asio::execution::
              any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
              ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()::
              fns;
  local_190._8_8_ = 0;
  local_190[0x10] = false;
  local_290.active = (activeProtector *)local_118;
  local_118._0_2_ = 1;
  local_118._8_8_ = (__pthread_internal_list *)0x0;
  uStack_108 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  uVar13 = (this->tickTimer).internalTimeCode;
  local_370._16_8_ = this;
  local_370._24_8_ = local_290.active;
  local_150[0] = owner;
  if ((0 < (long)uVar13) && (this->disable_timer == false)) {
    if (uVar13 < 500000000) {
      (this->tickTimer).internalTimeCode = 500000000;
    }
    local_350._0_2_ = 0x101;
    gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
              ((guarded<std::pair<bool,bool>,std::mutex> *)local_118,(pair<bool,_bool> *)local_350);
    lVar7 = std::chrono::_V2::steady_clock::now();
    lVar11 = (this->tickTimer).internalTimeCode;
    local_350._0_8_ = local_350._0_8_ & 0xffffffff00000000;
    local_350._8_8_ = std::_V2::system_category();
    ::asio::detail::
    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)local_190._0_8_,(implementation_type *)(local_190 + 8),(error_code *)local_350);
    local_190._8_8_ = lVar11 + lVar7;
    ::asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::
    async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)local_190,(type *)(local_370 + 0x10));
  }
  local_290.ticktimer = (steady_timer *)local_190;
  local_290.this = this;
  local_290.contextLoop = (LoopHandle *)local_3c8;
  local_3c8._8_8_ = std::chrono::_V2::steady_clock::now();
  (this->global_broker_id_local).gid = (this->global_id)._M_i.gid;
  if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
    this_00 = &this->actionQueue;
    iVar14 = 0;
    do {
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                (&local_e8,this_00);
      LOCK();
      (this->messageCounter).super___atomic_base<unsigned_long>._M_i =
           (this->messageCounter).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      if (this->dumplog == true) {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   &local_398,&local_e8);
      }
      if (local_e8.messageAction != cmd_ignore) {
        aVar4 = commandProcessor(this,&local_e8);
        uVar15 = local_3c8._0_8_;
        if (aVar4 < cmd_base_configure) {
          if (aVar4 < cmd_tick) {
            if (aVar4 == cmd_ignore) {
              iVar14 = iVar14 + 1;
            }
          }
          else if (aVar4 == cmd_tick) {
            if (((byte)local_e8.flags & 0x10) != 0) {
              local_3c8._0_8_ =
                   (__uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                    )0x0;
              if ((__pthread_internal_list *)uVar15 != (__pthread_internal_list *)0x0) {
                gmlc::networking::AsioContextManager::Servicer::~Servicer((Servicer *)uVar15);
                operator_delete((void *)uVar15,0x10);
              }
              gmlc::networking::AsioContextManager::startContextLoop
                        ((AsioContextManager *)local_350);
              uVar3 = local_350._0_8_;
              uVar15 = local_3c8._0_8_;
              local_350._0_8_ = (__pthread_internal_list *)0x0;
              local_3c8._0_8_ = uVar3;
              if ((_Tuple_impl<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   )uVar15 != (Servicer *)0x0) {
                gmlc::networking::AsioContextManager::Servicer::~Servicer((Servicer *)uVar15);
                operator_delete((void *)uVar15,0x10);
              }
              std::
              unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
              ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                             *)local_350);
            }
            if ((this->brokerState)._M_i == CONNECTED_ERROR) {
              lVar9 = std::chrono::_V2::steady_clock::now();
              lVar11 = (this->errorDelay).internalTimeCode;
              lVar7 = (this->errorTimeStart).__d.__r;
              lVar9 = lVar9 - lVar7;
              lVar8 = lVar11 / 1000000;
              aVar4 = cmd_user_disconnect;
              if ((SBORROW8(lVar9,lVar8 * 1000000) == lVar9 + lVar8 * -1000000 < 0) ||
                 (aVar4 = cmd_error_check, this->disable_timer != false)) {
                ActionMessage::setAction(&local_e8,aVar4);
                addActionMessage(this,&local_e8);
              }
              else {
                local_350._0_8_ = local_350._0_8_ & 0xffffffff00000000;
                local_350._8_8_ = std::_V2::system_category();
                ::asio::detail::
                deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                          *)local_190._0_8_,(implementation_type *)(local_190 + 8),
                         (error_code *)local_350);
                local_190._8_8_ = lVar11 + lVar7;
                local_350._0_2_ = 0x101;
                gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                          ((guarded<std::pair<bool,bool>,std::mutex> *)local_118,
                           (pair<bool,_bool> *)local_350);
                ::asio::
                basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                ::
                async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                          ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                            *)local_190,(type *)(local_370 + 0x10));
              }
            }
            else {
              if (iVar14 == 0) {
                local_e8.messageID = this->forwardingReasons | 1;
                (*this->_vptr_BrokerBase[5])(this,&local_e8);
              }
              else if (this->forwardTick == true) {
                local_e8.messageID = this->forwardingReasons;
              }
              lVar11 = std::chrono::_V2::steady_clock::now();
              uVar13 = (this->maxCoSimDuration).internalTimeCode;
              if (((long)uVar13 < 1) ||
                 (lVar8 = lVar11 - local_3c8._8_8_, uVar13 = uVar13 / 1000000,
                 lVar7 = uVar13 * 1000000,
                 lVar8 == lVar7 || SBORROW8(lVar8,lVar7) != (long)(lVar8 + uVar13 * -1000000) < 0))
              {
                lVar7 = (this->tickTimer).internalTimeCode;
                iVar14 = 0;
                if ((0 < lVar7) && (this->disable_timer == false)) {
                  local_350._0_8_ = local_350._0_8_ & 0xffffffff00000000;
                  local_350._8_8_ = std::_V2::system_category();
                  ::asio::detail::
                  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                            *)local_190._0_8_,(implementation_type *)(local_190 + 8),
                           (error_code *)local_350);
                  local_190._8_8_ = lVar7 + lVar11;
                  local_350._0_2_ = 0x101;
                  gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                            ((guarded<std::pair<bool,bool>,std::mutex> *)local_118,
                             (pair<bool,_bool> *)local_350);
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::
                  async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                              *)local_190,(type *)(local_370 + 0x10));
                }
              }
              else {
                ActionMessage::ActionMessage((ActionMessage *)local_350,cmd_timeout_disconnect);
                local_350._16_4_ = (this->global_broker_id_local).gid;
                local_350._8_4_ = local_350._16_4_;
                addActionMessage(this,(ActionMessage *)local_350);
                ActionMessage::~ActionMessage((ActionMessage *)local_350);
                iVar14 = 0;
              }
            }
          }
          else {
            if (aVar4 == cmd_stop) {
              queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_290);
              if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
                (*this->_vptr_BrokerBase[5])(this,&local_e8);
                LOCK();
                (this->mainLoopIsRunning)._M_base._M_i = false;
                UNLOCK();
                queueProcessingLoop::anon_class_16_2_af978e1b::operator()
                          ((anon_class_16_2_af978e1b *)this);
                (*this->_vptr_BrokerBase[3])(this,0);
              }
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              try_pop((optional<helics::ActionMessage> *)local_350,this_00);
              if (local_298 != true) goto LAB_002dcd86;
              goto LAB_002dc872;
            }
            if (aVar4 == cmd_terminate_immediately) goto LAB_002dcacb;
          }
        }
        else if (aVar4 == cmd_base_configure) {
          if (local_e8.messageAction == cmd_base_configure) {
            if (local_e8.messageID == 0x58) {
              LOCK();
              (((this->mLogManager).
                super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              forceLoggingFlush)._M_base._M_i = (__int_type)((byte)local_e8.flags >> 5 & 1);
              UNLOCK();
            }
            else if (local_e8.messageID == 0x59) {
              this->dumplog = (bool)((byte)local_e8.flags >> 5 & 1);
            }
          }
        }
        else if (aVar4 == cmd_ping) {
          iVar14 = (iVar14 + 1) - (uint)(local_e8.source_id.gid == 0);
          (*this->_vptr_BrokerBase[5])(this,&local_e8);
        }
        else if ((aVar4 == cmd_error_check) && ((this->brokerState)._M_i == CONNECTED_ERROR)) {
          lVar7 = std::chrono::_V2::steady_clock::now();
          lVar7 = lVar7 - (this->errorTimeStart).__d.__r;
          lVar11 = (this->errorDelay).internalTimeCode / 1000000;
          lVar8 = lVar11 * 1000000;
          if (lVar7 == lVar8 || SBORROW8(lVar7,lVar8) != lVar7 + lVar11 * -1000000 < 0) {
            lVar11 = (this->tickTimer).internalTimeCode;
            if ((lVar11 == lVar7 * 2 || SBORROW8(lVar11,lVar7 * 2) != lVar11 + lVar7 * -2 < 0) &&
               (this->disable_timer != true)) goto LAB_002dc7d8;
            local_350._0_8_ = (__pthread_internal_list *)0x0;
            local_350._8_8_ = (element_type *)0xbebc200;
            do {
              iVar5 = nanosleep((timespec *)local_350,(timespec *)local_350);
              if (iVar5 != -1) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
          }
          else {
            ActionMessage::setAction(&local_e8,cmd_user_disconnect);
          }
          addActionMessage(this,&local_e8);
        }
      }
LAB_002dc7d8:
      ActionMessage::~ActionMessage(&local_e8);
    } while( true );
  }
  queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_290);
  LOCK();
  (this->mainLoopIsRunning)._M_base._M_i = false;
  UNLOCK();
  goto LAB_002dcd93;
  while( true ) {
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
              ((optional<helics::ActionMessage> *)
               &((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value,this_00);
    std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
              ((_Optional_payload_base<helics::ActionMessage> *)local_350,
               (_Optional_payload_base<helics::ActionMessage> *)
               &((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value);
    if (local_1a8 == '\x01') {
      local_1a8 = '\0';
      ActionMessage::~ActionMessage
                (&((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value);
    }
    if (local_298 == false) break;
LAB_002dc872:
    if ((int)local_350._0_4_ < cmd_remove_filter) {
      uVar6 = local_350._0_4_ + cmd_disconnect;
      if ((0x26 < uVar6) ||
         (((0x600001fe1U >> ((ulong)uVar6 & 0x3f) & 1) == 0 &&
          (((ulong)uVar6 != 0x26 || (local_350._32_8_ != 0x7fffffffffffffff)))))) {
LAB_002dc8db:
        if (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          GVar2.gid = (this->global_broker_id_local).gid;
          local_3c8._8_8_ = (this->identifier)._M_dataplus._M_p;
          local_378 = (this->identifier)._M_string_length;
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3e8,"STOPPED unprocessed command ","");
          prettyPrintString_abi_cxx11_((string *)(local_3c8 + 0x10),(helics *)local_350,command_00);
          uVar15 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            uVar15 = local_3e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < (pointer)(local_3b0 + local_3e8._M_string_length)) {
            uVar15 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._16_8_ != &local_3a8) {
              uVar15 = local_3a8._M_allocated_capacity;
            }
            if ((ulong)uVar15 < (pointer)(local_3b0 + local_3e8._M_string_length))
            goto LAB_002dc97c;
            pbVar12 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3c8 + 0x10),0,0,local_3e8._M_dataplus._M_p,
                                 local_3e8._M_string_length);
          }
          else {
LAB_002dc97c:
            pbVar12 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_3e8,(char *)local_3c8._16_8_,local_3b0);
          }
          local_260._0_8_ = (pbVar12->_M_dataplus)._M_p;
          paVar1 = &pbVar12->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._0_8_ == paVar1) {
            local_260._16_8_ = paVar1->_M_allocated_capacity;
            local_260._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
            local_260._0_8_ =
                 &(((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value).dest_id;
          }
          else {
            local_260._16_8_ = paVar1->_M_allocated_capacity;
          }
          local_270 = pbVar12->_M_string_length;
          (pbVar12->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar12->_M_string_length = 0;
          paVar1->_M_local_buf[0] = '\0';
          pGStack_268 = (GlobalFederateId *)local_260._0_8_;
          message._M_str = (char *)local_260._0_8_;
          message._M_len = local_270;
          name._M_str = (char *)local_3c8._8_8_;
          name._M_len = local_378;
          local_260._8_8_ = local_270;
          sendToLogger(this,GVar2,0x18,name,message,false);
          if ((GlobalFederateId *)local_260._0_8_ !=
              &(((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value).dest_id) {
            operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._16_8_ != &local_3a8) {
            operator_delete((void *)local_3c8._16_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,
                            (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
          }
        }
      }
    }
    else if ((((3 < (uint)(local_350._0_4_ + 0xfffffc12)) || (local_350._0_4_ + 0xfffffc12 == 1)) &&
             (local_350._0_4_ != cmd_remove_filter)) && (local_350._0_4_ != cmd_remove_endpoint))
    goto LAB_002dc8db;
  }
  goto LAB_002dcd86;
LAB_002dcacb:
  queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_290);
  LOCK();
  (this->mainLoopIsRunning)._M_base._M_i = false;
  UNLOCK();
  queueProcessingLoop::anon_class_16_2_af978e1b::operator()((anon_class_16_2_af978e1b *)this);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
            ((optional<helics::ActionMessage> *)local_350,this_00);
  if (local_298 == true) {
    do {
      if ((int)local_350._0_4_ < cmd_remove_filter) {
        uVar6 = local_350._0_4_ + cmd_disconnect;
        if ((0x26 < uVar6) ||
           (((0x600001fe1U >> ((ulong)uVar6 & 0x3f) & 1) == 0 &&
            (((ulong)uVar6 != 0x26 || (local_350._32_8_ != 0x7fffffffffffffff)))))) {
LAB_002dcb9b:
          if (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
            GVar2.gid = (this->global_broker_id_local).gid;
            local_3c8._8_8_ = (this->identifier)._M_dataplus._M_p;
            local_378 = (this->identifier)._M_string_length;
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3e8,"TI unprocessed command ","");
            prettyPrintString_abi_cxx11_
                      ((string *)(local_3c8 + 0x10),(helics *)local_350,command_01);
            uVar15 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              uVar15 = local_3e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < (pointer)(local_3b0 + local_3e8._M_string_length)) {
              uVar15 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._16_8_ != &local_3a8) {
                uVar15 = local_3a8._M_allocated_capacity;
              }
              if ((ulong)uVar15 < (pointer)(local_3b0 + local_3e8._M_string_length))
              goto LAB_002dcc3c;
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_3c8 + 0x10),0,0,local_3e8._M_dataplus._M_p,
                                   local_3e8._M_string_length);
            }
            else {
LAB_002dcc3c:
              pbVar12 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_3e8,(char *)local_3c8._16_8_,local_3b0);
            }
            local_260._0_8_ = (pbVar12->_M_dataplus)._M_p;
            paVar1 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._0_8_ == paVar1) {
              local_260._16_8_ = paVar1->_M_allocated_capacity;
              local_260._24_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_260._0_8_ =
                   &(((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value).dest_id;
            }
            else {
              local_260._16_8_ = paVar1->_M_allocated_capacity;
            }
            local_260._8_8_ = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar12->_M_string_length = 0;
            paVar1->_M_local_buf[0] = '\0';
            pGStack_198 = (GlobalFederateId *)local_260._0_8_;
            message_00._M_str = (char *)local_260._0_8_;
            message_00._M_len = local_260._8_8_;
            name_00._M_str = (char *)local_3c8._8_8_;
            name_00._M_len = local_378;
            local_1a0 = local_260._8_8_;
            sendToLogger(this,GVar2,0x18,name_00,message_00,false);
            if ((GlobalFederateId *)local_260._0_8_ !=
                &(((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value).dest_id) {
              operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._16_8_ != &local_3a8) {
              operator_delete((void *)local_3c8._16_8_,(ulong)(local_3a8._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p,
                              (ulong)(local_3e8.field_2._M_allocated_capacity + 1));
            }
          }
        }
      }
      else if (((3 < (uint)(local_350._0_4_ + 0xfffffc12)) || (local_350._0_4_ + 0xfffffc12 == 1))
              && ((local_350._0_4_ != cmd_remove_filter && (local_350._0_4_ != cmd_remove_endpoint))
                 )) goto LAB_002dcb9b;
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                ((optional<helics::ActionMessage> *)
                 &((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value,this_00);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                ((_Optional_payload_base<helics::ActionMessage> *)local_350,
                 (_Optional_payload_base<helics::ActionMessage> *)
                 &((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value);
      if (local_1a8 == '\x01') {
        local_1a8 = '\0';
        ActionMessage::~ActionMessage
                  (&((_Storage<helics::ActionMessage,_false> *)local_260)->_M_value);
      }
    } while (local_298 != false);
  }
LAB_002dcd86:
  ActionMessage::~ActionMessage(&local_e8);
LAB_002dcd93:
  ::asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::~io_object_impl((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                     *)local_190);
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)local_3c8);
  if ((element_type *)local_370._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_);
  }
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)&local_398);
  return;
}

Assistant:

void BrokerBase::queueProcessingLoop()
{
    if (haltOperations) {
        mainLoopIsRunning.store(false);
        return;
    }
    std::vector<ActionMessage> dumpMessages;
#ifndef HELICS_DISABLE_ASIO
    auto serv = gmlc::networking::AsioContextManager::getContextPointer();
    auto contextLoop = serv->startContextLoop();
    asio::steady_timer ticktimer(serv->getBaseContext());
    activeProtector active(true, false);

    auto timerCallback = [this, &active](const std::error_code& errorCode) {
        timerTickHandler(this, active, errorCode);
    };
    if (tickTimer > timeZero && !disable_timer) {
        if (tickTimer < Time(0.5)) {
            tickTimer = Time(0.5);
        }
        active = std::make_pair(true, true);
        ticktimer.expires_at(std::chrono::steady_clock::now() + tickTimer.to_ns());
        ticktimer.async_wait(timerCallback);
    }
    auto timerStop = [&, this]() {
        if (!haltTimer(active, ticktimer)) {
            sendToLogger(global_broker_id_local,
                         LogLevels::WARNING,
                         identifier,
                         "timer unable to cancel properly");
        }
        contextLoop = nullptr;
    };
    auto timeStart = std::chrono::steady_clock::now();
#else
    auto timerStop = []() {};
#endif

    global_broker_id_local = global_id.load();
    int messagesSinceLastTick = 0;
    auto logDump = [&, this]() {
        if (!dumpMessages.empty()) {
            for (auto& act : dumpMessages) {
                mLogManager->sendToLogger(HELICS_LOG_LEVEL_DUMPLOG,
                                          identifier,
                                          fmt::format("|| dl cmd:{} from {} to {}",
                                                      prettyPrintString(act),
                                                      act.source_id.baseValue(),
                                                      act.dest_id.baseValue()));
            }
        }
    };
    if (haltOperations) {
        timerStop();
        mainLoopIsRunning.store(false);
        return;
    }
    while (true) {
        auto command = actionQueue.pop();
        ++messageCounter;
        if (dumplog) {
            dumpMessages.push_back(command);
        }
        if (command.action() == CMD_IGNORE) {
            continue;
        }
        auto ret = commandProcessor(command);
        if (ret == CMD_IGNORE) {
            ++messagesSinceLastTick;
            continue;
        }
        switch (ret) {
            case CMD_TICK:
                if (checkActionFlag(command, error_flag)) {
#ifndef HELICS_DISABLE_ASIO
                    contextLoop = nullptr;
                    contextLoop = serv->startContextLoop();
#endif
                }
                // deal with error state timeout
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff >= errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (!disable_timer) {
                            ticktimer.expires_at(errorTimeStart + errorDelay.to_ns());
                            active = std::make_pair(true, true);
                            ticktimer.async_wait(timerCallback);
                        } else {
                            command.setAction(CMD_ERROR_CHECK);
                            addActionMessage(command);
                        }
#else
                        command.setAction(CMD_ERROR_CHECK);
                        addActionMessage(command);
#endif
                    }
                    break;
                }
#ifndef DISABLE_TICK
                if (messagesSinceLastTick == 0) {
                    command.messageID =
                        forwardingReasons | static_cast<uint32_t>(TickForwardingReasons::NO_COMMS);
                    processCommand(std::move(command));
                } else if (forwardTick) {
                    command.messageID = forwardingReasons;
                }
#endif
                messagesSinceLastTick = 0;
// reschedule the timer
#ifndef HELICS_DISABLE_ASIO
                {
                    auto currTime = std::chrono::steady_clock::now();
                    if (maxCoSimDuration > timeZero) {
                        if ((currTime - timeStart) > maxCoSimDuration.to_ms()) {
                            ActionMessage dDisable(CMD_TIMEOUT_DISCONNECT);
                            dDisable.source_id = global_broker_id_local;
                            dDisable.dest_id = global_broker_id_local;
                            addActionMessage(dDisable);
                            break;
                        }
                    }
                    if (tickTimer > timeZero && !disable_timer) {
                        ticktimer.expires_at(currTime + tickTimer.to_ns());
                        active = std::make_pair(true, true);
                        ticktimer.async_wait(timerCallback);
                    }
                }
#endif
                break;
            case CMD_ERROR_CHECK:
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff > errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (tickTimer > timeDiff * 2 || disable_timer) {
                            std::this_thread::sleep_for(std::chrono::milliseconds(200));
                            addActionMessage(command);
                        }
#else
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                        addActionMessage(command);
#endif
                    }
                }
                break;
            case CMD_PING:
                // ping is processed normally but doesn't count as an actual message for timeout
                // purposes unless it comes from the parent
                if (command.source_id != parent_broker_id) {
                    ++messagesSinceLastTick;
                }
                processCommand(std::move(command));
                break;
            case CMD_BASE_CONFIGURE:
                baseConfigure(command);
                break;
            case CMD_IGNORE:
            default:
                break;
            case CMD_TERMINATE_IMMEDIATELY:
                timerStop();
                mainLoopIsRunning.store(false);
                logDump();
                {
                    auto tcmd = actionQueue.try_pop();
                    while (tcmd) {
                        if (!isDisconnectCommand(*tcmd)) {
                            LOG_TRACE(global_broker_id_local,
                                      identifier,
                                      std::string("TI unprocessed command ") +
                                          prettyPrintString(*tcmd));
                        }
                        tcmd = actionQueue.try_pop();
                    }
                }
                return;  // immediate return
            case CMD_STOP:
                timerStop();
                if (!haltOperations) {
                    processCommand(std::move(command));
                    mainLoopIsRunning.store(false);
                    logDump();
                    processDisconnect();
                }
                auto tcmd = actionQueue.try_pop();
                while (tcmd) {
                    if (!isDisconnectCommand(*tcmd)) {
                        LOG_TRACE(global_broker_id_local,
                                  identifier,
                                  std::string("STOPPED unprocessed command ") +
                                      prettyPrintString(*tcmd));
                    }
                    tcmd = actionQueue.try_pop();
                }
                return;
        }
    }
}